

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O0

void getUserParamsFromOptions
               (HighsOptions *options,cupdlp_bool *ifChangeIntParam,cupdlp_int *intParam,
               cupdlp_bool *ifChangeFloatParam,cupdlp_float *floatParam)

{
  HighsInt *pHVar1;
  cupdlp_int cVar2;
  long in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined1 *in_RSI;
  HighsOptions *in_RDI;
  long in_R8;
  cupdlp_int i_1;
  cupdlp_int i;
  HighsInt local_34;
  int local_30;
  int local_2c;
  
  pHVar1 = (HighsInt *)CONCAT71(in_register_00000011,in_DL);
  for (local_2c = 0; local_2c < 0xc; local_2c = local_2c + 1) {
    in_RSI[local_2c] = 0;
  }
  for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
    *(undefined1 *)(in_RCX + local_30) = 0;
  }
  *in_RSI = 1;
  if ((in_RDI->super_HighsOptionsStruct).pdlp_iteration_limit < -0x80000000) {
    local_34 = (in_RDI->super_HighsOptionsStruct).pdlp_iteration_limit;
  }
  else {
    local_34 = 0x7fffffff;
  }
  *pHVar1 = local_34;
  in_RSI[8] = 1;
  cVar2 = getCupdlpLogLevel(in_RDI);
  pHVar1[8] = cVar2;
  in_RSI[1] = 1;
  pHVar1[1] = (uint)(((in_RDI->super_HighsOptionsStruct).pdlp_scaling & 1U) != 0);
  *(undefined1 *)(in_RCX + 1) = 1;
  *(double *)(in_R8 + 8) = (in_RDI->super_HighsOptionsStruct).primal_feasibility_tolerance;
  *(undefined1 *)(in_RCX + 2) = 1;
  *(double *)(in_R8 + 0x10) = (in_RDI->super_HighsOptionsStruct).dual_feasibility_tolerance;
  *(undefined1 *)(in_RCX + 3) = 1;
  *(double *)(in_R8 + 0x18) = (in_RDI->super_HighsOptionsStruct).pdlp_d_gap_tol;
  *(undefined1 *)(in_RCX + 5) = 1;
  *(double *)(in_R8 + 0x28) = (in_RDI->super_HighsOptionsStruct).time_limit;
  in_RSI[4] = 1;
  pHVar1[4] = (in_RDI->super_HighsOptionsStruct).pdlp_e_restart_method;
  in_RSI[0xb] = 1;
  pHVar1[0xb] = (uint)(((in_RDI->super_HighsOptionsStruct).pdlp_native_termination ^ 0xffU) & 1);
  return;
}

Assistant:

void getUserParamsFromOptions(const HighsOptions& options,
                              cupdlp_bool* ifChangeIntParam,
                              cupdlp_int* intParam,
                              cupdlp_bool* ifChangeFloatParam,
                              cupdlp_float* floatParam) {
  for (cupdlp_int i = 0; i < N_INT_USER_PARAM; ++i) ifChangeIntParam[i] = false;
  for (cupdlp_int i = 0; i < N_FLOAT_USER_PARAM; ++i)
    ifChangeFloatParam[i] = false;
  // Assume all PDLP-related options in HiGHS cause changes
  ifChangeIntParam[N_ITER_LIM] = true;
  // If HiGHS is using 64-bit integers, then the default value of
  // options.pdlp_iteration_limit is kHighsIInf, so copying this to
  // intParam[N_ITER_LIM] will overflow.
  intParam[N_ITER_LIM] = cupdlp_int(options.pdlp_iteration_limit > kHighsIInf32
                                        ? kHighsIInf32
                                        : options.pdlp_iteration_limit);
  //
  ifChangeIntParam[N_LOG_LEVEL] = true;
  intParam[N_LOG_LEVEL] = getCupdlpLogLevel(options);
  //
  ifChangeIntParam[IF_SCALING] = true;
  intParam[IF_SCALING] = options.pdlp_scaling ? 1 : 0;
  //
  ifChangeFloatParam[D_PRIMAL_TOL] = true;
  floatParam[D_PRIMAL_TOL] = options.primal_feasibility_tolerance;
  //
  ifChangeFloatParam[D_DUAL_TOL] = true;
  floatParam[D_DUAL_TOL] = options.dual_feasibility_tolerance;
  //
  ifChangeFloatParam[D_GAP_TOL] = true;
  floatParam[D_GAP_TOL] = options.pdlp_d_gap_tol;
  //
  ifChangeFloatParam[D_TIME_LIM] = true;
  floatParam[D_TIME_LIM] = options.time_limit;
  //
  ifChangeIntParam[E_RESTART_METHOD] = true;
  intParam[E_RESTART_METHOD] = int(options.pdlp_e_restart_method);
  //

  // for the moment only native termination is allowed with GPU
#ifdef CUPDLP_CPU 
#ifdef CUPDLP_FORCE_NATIVE
  ifChangeIntParam[I_INF_NORM_ABS_LOCAL_TERMINATION] = false;
  if (!options.pdlp_native_termination) {
    printf("Warning: CUPDLP_FORCE_NATIVE is on. Forcing pdlp_native_termination=on.\n");
  }
#else
  ifChangeIntParam[I_INF_NORM_ABS_LOCAL_TERMINATION] = true;
  intParam[I_INF_NORM_ABS_LOCAL_TERMINATION] = !options.pdlp_native_termination;
#endif
#else
  ifChangeIntParam[I_INF_NORM_ABS_LOCAL_TERMINATION] = false;

  if (intParam[N_LOG_LEVEL]) {
    if (!options.pdlp_native_termination) {
      printf("GPU only supports pdlp_native_termination=on. Forcing pdlp_native_termination=on.\n");
    }
  }
#endif
}